

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O0

HCOSE_SIGN0 COSE_Sign0_Init(COSE_INIT_FLAGS flags,cose_errback *perr)

{
  _Bool _Var1;
  COSE_Sign0Message *pobj;
  cose_errback *perr_local;
  COSE *pCStack_10;
  COSE_INIT_FLAGS flags_local;
  
  if (flags == COSE_INIT_FLAGS_NONE) {
    pCStack_10 = (COSE *)calloc(1,0x58);
    if (pCStack_10 == (COSE *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
      }
      pCStack_10 = (COSE *)0x0;
    }
    else {
      _Var1 = _COSE_Init(COSE_INIT_FLAGS_NONE,pCStack_10,0x62,perr);
      if (_Var1) {
        _COSE_InsertInList(&Sign0Root,pCStack_10);
      }
      else {
        _COSE_Sign0_Release((COSE_Sign0Message *)pCStack_10);
        free(pCStack_10);
        pCStack_10 = (COSE *)0x0;
      }
    }
  }
  else {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
    pCStack_10 = (COSE *)0x0;
  }
  return (HCOSE_SIGN0)pCStack_10;
}

Assistant:

HCOSE_SIGN0 COSE_Sign0_Init(COSE_INIT_FLAGS flags, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	CHECK_CONDITION(flags == COSE_INIT_FLAGS_NONE, COSE_ERR_INVALID_PARAMETER);
	COSE_Sign0Message * pobj = (COSE_Sign0Message *)COSE_CALLOC(1, sizeof(COSE_Sign0Message), context);
	if (pobj == NULL) {
		if (perr != NULL) perr->err = COSE_ERR_OUT_OF_MEMORY;
		return NULL;
	}

	if (!_COSE_Init(flags,&pobj->m_message, COSE_sign_object, CBOR_CONTEXT_PARAM_COMMA perr)) {
		_COSE_Sign0_Release(pobj);
		COSE_FREE(pobj, context);
		return NULL;
	}

	_COSE_InsertInList(&Sign0Root, &pobj->m_message);

	return (HCOSE_SIGN0)pobj;

errorReturn:
	return NULL;
}